

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__decode_jpeg_image(stbi__jpeg *j)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi__uint32 sVar4;
  stbi__uint32 NL;
  int Ld;
  int m;
  stbi__jpeg *j_local;
  
  for (NL = 0; (int)NL < 4; NL = NL + 1) {
    j->img_comp[(int)NL].raw_data = (void *)0x0;
    j->img_comp[(int)NL].raw_coeff = (void *)0x0;
  }
  j->restart_interval = 0;
  iVar3 = stbi__decode_jpeg_header(j,0);
  if (iVar3 == 0) {
    j_local._4_4_ = 0;
  }
  else {
    bVar1 = stbi__get_marker(j);
    NL = (stbi__uint32)bVar1;
    while (NL != 0xd9) {
      if (NL == 0xda) {
        iVar3 = stbi__process_scan_header(j);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = stbi__parse_entropy_coded_data(j);
        if (iVar3 == 0) {
          return 0;
        }
        if (j->marker == 0xff) {
          sVar2 = stbi__skip_jpeg_junk_at_end(j);
          j->marker = sVar2;
        }
        bVar1 = stbi__get_marker(j);
        NL = (stbi__uint32)bVar1;
        if ((0xcf < NL) && (NL < 0xd8)) {
          bVar1 = stbi__get_marker(j);
          NL = (stbi__uint32)bVar1;
        }
      }
      else {
        if (NL == 0xdc) {
          iVar3 = stbi__get16be(j->s);
          sVar4 = stbi__get16be(j->s);
          if (iVar3 != 4) {
            iVar3 = stbi__err("bad DNL len");
            return iVar3;
          }
          if (sVar4 != j->s->img_y) {
            iVar3 = stbi__err("bad DNL height");
            return iVar3;
          }
          bVar1 = stbi__get_marker(j);
        }
        else {
          iVar3 = stbi__process_marker(j,NL);
          if (iVar3 == 0) {
            return 1;
          }
          bVar1 = stbi__get_marker(j);
        }
        NL = (stbi__uint32)bVar1;
      }
    }
    if (j->progressive != 0) {
      stbi__jpeg_finish(j);
    }
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__decode_jpeg_image(stbi__jpeg *j)
{
   int m;
   for (m = 0; m < 4; m++) {
      j->img_comp[m].raw_data = NULL;
      j->img_comp[m].raw_coeff = NULL;
   }
   j->restart_interval = 0;
   if (!stbi__decode_jpeg_header(j, STBI__SCAN_load)) return 0;
   m = stbi__get_marker(j);
   while (!stbi__EOI(m)) {
      if (stbi__SOS(m)) {
         if (!stbi__process_scan_header(j)) return 0;
         if (!stbi__parse_entropy_coded_data(j)) return 0;
         if (j->marker == STBI__MARKER_none ) {
         j->marker = stbi__skip_jpeg_junk_at_end(j);
            // if we reach eof without hitting a marker, stbi__get_marker() below will fail and we'll eventually return 0
         }
         m = stbi__get_marker(j);
         if (STBI__RESTART(m))
            m = stbi__get_marker(j);
      } else if (stbi__DNL(m)) {
         int Ld = stbi__get16be(j->s);
         stbi__uint32 NL = stbi__get16be(j->s);
         if (Ld != 4) return stbi__err("bad DNL len", "Corrupt JPEG");
         if (NL != j->s->img_y) return stbi__err("bad DNL height", "Corrupt JPEG");
         m = stbi__get_marker(j);
      } else {
         if (!stbi__process_marker(j, m)) return 1;
         m = stbi__get_marker(j);
      }
   }
   if (j->progressive)
      stbi__jpeg_finish(j);
   return 1;
}